

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O1

Optional<unsigned_int> __thiscall
llvm::MCRegisterInfo::getLLVMRegNum(MCRegisterInfo *this,uint RegNum,bool isEH)

{
  DwarfLLVMRegPair *pDVar1;
  uint uVar2;
  DwarfLLVMRegPair *pDVar3;
  ulong uVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong uVar7;
  
  pDVar3 = (&this->Dwarf2LRegs)[CONCAT71(in_register_00000011,isEH) & 0xffffffff];
  if (pDVar3 == (DwarfLLVMRegPair *)0x0) {
    uVar4 = 0;
    uVar2 = 0;
    uVar5 = 0;
  }
  else {
    uVar4 = (ulong)(&this->Dwarf2LRegsSize)[isEH];
    pDVar1 = pDVar3 + uVar4;
    if (uVar4 != 0) {
      do {
        uVar6 = uVar4 >> 1;
        uVar7 = ~uVar6 + uVar4;
        uVar4 = uVar6;
        if (pDVar3[uVar6].FromReg < RegNum) {
          pDVar3 = pDVar3 + uVar6 + 1;
          uVar4 = uVar7;
        }
      } while (0 < (long)uVar4);
    }
    if ((pDVar3 == pDVar1) || (pDVar3->FromReg != RegNum)) {
      uVar4 = 0;
      uVar2 = 0;
      uVar5 = 0;
    }
    else {
      uVar2 = pDVar3->ToReg & 0xff;
      uVar5 = pDVar3->ToReg & 0xffffff00;
      uVar4 = 0x100000000;
    }
  }
  return (Optional<unsigned_int>)((uVar2 | uVar5) | uVar4);
}

Assistant:

Optional<unsigned> MCRegisterInfo::getLLVMRegNum(unsigned RegNum,
                                                 bool isEH) const {
  const DwarfLLVMRegPair *M = isEH ? EHDwarf2LRegs : Dwarf2LRegs;
  unsigned Size = isEH ? EHDwarf2LRegsSize : Dwarf2LRegsSize;

  if (!M)
    return None;
  DwarfLLVMRegPair Key = { RegNum, 0 };
  const DwarfLLVMRegPair *I = std::lower_bound(M, M+Size, Key);
  if (I != M + Size && I->FromReg == RegNum)
    return I->ToReg;
  return None;
}